

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

InnerProductParameter * __thiscall
caffe::InnerProductParameter::New(InnerProductParameter *this,Arena *arena)

{
  InnerProductParameter *this_00;
  
  this_00 = (InnerProductParameter *)operator_new(0x38);
  InnerProductParameter(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<caffe::InnerProductParameter>(arena,this_00);
  }
  return this_00;
}

Assistant:

InnerProductParameter* InnerProductParameter::New(::google::protobuf::Arena* arena) const {
  InnerProductParameter* n = new InnerProductParameter;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}